

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

unsigned_long __thiscall CTPNStmTryBase::get_control_flow(CTPNStmTryBase *this,int warn)

{
  CTPNStm *pCVar1;
  CTPNStmFinally *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  CTPNStmCatch *pCVar7;
  
  pCVar1 = this->body_stm_;
  if (pCVar1 == (CTPNStm *)0x0) {
    uVar6 = 1;
  }
  else {
    iVar3 = (*(pCVar1->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
              [0x1c])(pCVar1,warn);
    uVar6 = CONCAT44(extraout_var,iVar3);
  }
  for (pCVar7 = this->first_catch_stm_; pCVar7 != (CTPNStmCatch *)0x0;
      pCVar7 = (pCVar7->super_CTPNStmCatchBase).next_catch_) {
    iVar3 = (*(pCVar7->super_CTPNStmCatchBase).super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.
              super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1c])(pCVar7,warn);
    uVar6 = uVar6 | CONCAT44(extraout_var_00,iVar3);
  }
  pCVar2 = this->finally_stm_;
  if (pCVar2 == (CTPNStmFinally *)0x0) {
    uVar4 = 1;
  }
  else {
    iVar3 = (*(pCVar2->super_CTPNStmFinallyBase).super_CTPNStmEnclosing.super_CTPNStm.
              super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x1c])
                      (pCVar2,warn);
    uVar4 = CONCAT44(extraout_var_01,iVar3);
  }
  uVar5 = uVar6 & 0xffffffffffffff82;
  if ((uVar4 & 1) != 0) {
    uVar5 = uVar6;
  }
  return uVar4 & 0xfffffffffffffffe | uVar5;
}

Assistant:

unsigned long CTPNStmTryBase::get_control_flow(int warn) const
{
    unsigned long flags;
    unsigned long fin_flags;
    CTPNStmCatch *cur_catch;
    
    /*
     *   First, determine the control flow through the protected code.  If
     *   it exits, we either exit or proceed to the 'finally' clause.  
     */
    flags = (body_stm_ != 0
             ? body_stm_->get_control_flow(warn) : TCPRS_FLOW_NEXT);

    /* 
     *   Next, figure out what the various 'catch' clauses can do.  We
     *   assume that each 'catch' clause is enterable, since any exception
     *   could occur within the protected code (whether it explicitly
     *   throws or not - it could call a function or method that throws).
     *   So, we can simply OR together with the main block's flags all of
     *   the ways the different 'catch' clauses can exit.  
     */
    for (cur_catch = first_catch_stm_ ; cur_catch != 0 ;
         cur_catch = cur_catch->get_next_catch())
    {
        /* OR in the flags for this 'catch' block */
        flags |= cur_catch->get_control_flow(warn);
    }

    /*
     *   If we have a 'finally' clause, it is definitely enterable, since
     *   every other way of leaving the protected code goes through it.
     *   Find how it can exit.  
     */
    fin_flags = (finally_stm_ != 0
                 ? finally_stm_->get_control_flow(warn)
                 : TCPRS_FLOW_NEXT);

    /* 
     *   If the 'finally' block can't flow to next, then neither can the
     *   main/catch blocks.  In addition, the main/catch blocks can't
     *   'break', 'continue', 'goto', or 'return' either, because the
     *   'finally' block will not allow the other blocks to proceed with
     *   whatever transfers they attempt.  So, if 'next' isn't set in the
     *   'finally' flags, clear out all of these flags from the main/catch
     *   flags.  
     */
    if (!(fin_flags & TCPRS_FLOW_NEXT))
        flags &= ~(TCPRS_FLOW_NEXT
                   | TCPRS_FLOW_BREAK
                   | TCPRS_FLOW_CONT
                   | TCPRS_FLOW_RET_VAL
                   | TCPRS_FLOW_RET_VOID
                   | TCPRS_FLOW_GOTO);

    /* 
     *   Add in the remaining flags from the 'finally' block, since
     *   whatever it does, the overall statement does.  However, ignore
     *   'next' flags in the 'finally' block, because if the 'finally'
     *   code goes to next, it just means that we keep doing whatever we
     *   were doing in the main block.  
     */
    fin_flags &= ~TCPRS_FLOW_NEXT;
    flags |= fin_flags;

    /* return the result */
    return flags;
}